

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QCss::AnimationRule>::emplace<QCss::AnimationRule_const&>
          (QMovableArrayOps<QCss::AnimationRule> *this,qsizetype i,AnimationRule *args)

{
  qsizetype *pqVar1;
  AnimationRule **ppAVar2;
  AnimationRule *pAVar3;
  Data *pDVar4;
  long lVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  AnimationRule *pAVar9;
  Data *pDVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet> QStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
           super_QArrayDataPointer<QCss::AnimationRule>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_005f8c00:
    pDVar6 = (args->animName).d.d;
    pcVar7 = (args->animName).d.ptr;
    qVar8 = (args->animName).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    QStack_50.d = (args->ruleSets).d.d;
    QStack_50.ptr = (args->ruleSets).d.ptr;
    QStack_50.size = (args->ruleSets).d.size;
    if (QStack_50.d != (Data *)0x0) {
      LOCK();
      ((QStack_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar11 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
             super_QArrayDataPointer<QCss::AnimationRule>.size != 0;
    QArrayDataPointer<QCss::AnimationRule>::detachAndGrow
              ((QArrayDataPointer<QCss::AnimationRule> *)this,(uint)(i == 0 && bVar11),1,
               (AnimationRule **)0x0,(QArrayDataPointer<QCss::AnimationRule> *)0x0);
    pAVar9 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
             super_QArrayDataPointer<QCss::AnimationRule>.ptr;
    if (i == 0 && bVar11) {
      pAVar9[-1].animName.d.d = pDVar6;
      pAVar9[-1].animName.d.ptr = pcVar7;
      pAVar9[-1].animName.d.size = qVar8;
      pAVar9[-1].ruleSets.d.d = QStack_50.d;
      pAVar9[-1].ruleSets.d.ptr = QStack_50.ptr;
      pAVar9[-1].ruleSets.d.size = QStack_50.size;
      (this->super_QGenericArrayOps<QCss::AnimationRule>).
      super_QArrayDataPointer<QCss::AnimationRule>.ptr = pAVar9 + -1;
    }
    else {
      pAVar3 = pAVar9 + i;
      memmove(pAVar3 + 1,pAVar9 + i,
              ((this->super_QGenericArrayOps<QCss::AnimationRule>).
               super_QArrayDataPointer<QCss::AnimationRule>.size - i) * 0x30);
      (pAVar3->animName).d.d = pDVar6;
      (pAVar3->animName).d.ptr = pcVar7;
      (pAVar3->animName).d.size = qVar8;
      (pAVar3->ruleSets).d.d = QStack_50.d;
      (pAVar3->ruleSets).d.ptr = QStack_50.ptr;
      (pAVar3->ruleSets).d.size = QStack_50.size;
    }
    QStack_50.size = 0;
    QStack_50.ptr = (AnimationRuleSet *)0x0;
    QStack_50.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
              super_QArrayDataPointer<QCss::AnimationRule>.size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>::~QArrayDataPointer(&QStack_50);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
            super_QArrayDataPointer<QCss::AnimationRule>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QCss::AnimationRule>).
                      super_QArrayDataPointer<QCss::AnimationRule>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pAVar9 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
               super_QArrayDataPointer<QCss::AnimationRule>.ptr;
      pDVar6 = (args->animName).d.d;
      pAVar9[lVar5].animName.d.d = pDVar6;
      pAVar9[lVar5].animName.d.ptr = (args->animName).d.ptr;
      pAVar9[lVar5].animName.d.size = (args->animName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar10 = (args->ruleSets).d.d;
      pAVar9[lVar5].ruleSets.d.d = pDVar10;
      pAVar9[lVar5].ruleSets.d.ptr = (args->ruleSets).d.ptr;
      pAVar9[lVar5].ruleSets.d.size = (args->ruleSets).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((AnimationRule *)
          ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QCss::AnimationRule>).
          super_QArrayDataPointer<QCss::AnimationRule>.ptr)) goto LAB_005f8c00;
      pAVar9 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
               super_QArrayDataPointer<QCss::AnimationRule>.ptr;
      pDVar6 = (args->animName).d.d;
      pAVar9[-1].animName.d.d = pDVar6;
      pAVar9[-1].animName.d.ptr = (args->animName).d.ptr;
      pAVar9[-1].animName.d.size = (args->animName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar10 = (args->ruleSets).d.d;
      pAVar9[-1].ruleSets.d.d = pDVar10;
      pAVar9[-1].ruleSets.d.ptr = (args->ruleSets).d.ptr;
      pAVar9[-1].ruleSets.d.size = (args->ruleSets).d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppAVar2 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
                 super_QArrayDataPointer<QCss::AnimationRule>.ptr;
      *ppAVar2 = *ppAVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
              super_QArrayDataPointer<QCss::AnimationRule>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }